

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uname.cpp
# Opt level: O2

int fs_is_wsl(void)

{
  int iVar1;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  utsname buf;
  
  iVar1 = uname((utsname *)&buf);
  if (iVar1 == 0) {
    sVar2 = strlen(buf.sysname);
    __x._M_str = buf.sysname;
    __x._M_len = sVar2;
    __y._M_str = "Linux";
    __y._M_len = 5;
    std::operator!=(__x,__y);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int fs_is_wsl()
{

#ifdef HAVE_UTSNAME
  struct utsname buf;
  if (uname(&buf) != 0)
    return -1;

  std::string_view s(buf.sysname);
  std::string_view r(buf.release);

  if(s != "Linux")
    return 0;
#ifdef __cpp_lib_starts_ends_with // C++20
  if (r.ends_with("microsoft-standard-WSL2"))
    return 2;
  if (r.ends_with("-Microsoft"))
    return 1;
#endif
#endif
  return 0;
}